

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O1

void leveldb::_Test_VaryingLengths::_RunIt(void)

{
  _Test_VaryingLengths t;
  BloomTest local_48;
  
  local_48.policy_ = NewBloomFilterPolicy(10);
  local_48.filter_._M_dataplus._M_p = (pointer)&local_48.filter_.field_2;
  local_48.filter_._M_string_length = 0;
  local_48.filter_.field_2._M_local_buf[0] = '\0';
  local_48.keys_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.keys_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.keys_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Run((_Test_VaryingLengths *)&local_48);
  BloomTest::~BloomTest(&local_48);
  return;
}

Assistant:

BloomTest() : policy_(NewBloomFilterPolicy(10)) {}